

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synced_bcf_reader.c
# Opt level: O2

int bcf_sr_add_reader(bcf_srs_t *files,char *fname)

{
  htsExactFormat hVar1;
  char *pcVar2;
  bcf_sr_t *pbVar3;
  int iVar4;
  htsFile *hfp;
  int *piVar5;
  bcf_sr_t *pbVar6;
  tbx_t *ptVar7;
  bcf_hdr_t *pbVar8;
  hts_idx_t *phVar9;
  char **__ptr;
  bcf_sr_regions_t *pbVar10;
  int iVar11;
  bcf_sr_t *pbVar12;
  long lVar13;
  char *pcVar14;
  char *p;
  char *local_70;
  int n;
  size_t sStack_60;
  char *local_58;
  bcf_sr_t *local_48;
  bcf_srs_t *local_40;
  bcf_hdr_t *local_38;
  
  hfp = hts_open(fname,"r");
  if (hfp == (htsFile *)0x0) {
    files->errnum = open_failed;
    return 0;
  }
  piVar5 = (int *)realloc(files->has_line,(long)files->nreaders * 4 + 4);
  files->has_line = piVar5;
  iVar11 = files->nreaders;
  piVar5[iVar11] = 0;
  pbVar6 = (bcf_sr_t *)realloc(files->readers,(long)iVar11 * 0x60 + 0x60);
  files->readers = pbVar6;
  iVar11 = files->nreaders;
  files->nreaders = iVar11 + 1;
  pbVar12 = pbVar6 + iVar11;
  pbVar6[iVar11].tbx_idx = (tbx_t *)0x0;
  (&pbVar6[iVar11].tbx_idx)[1] = (tbx_t *)0x0;
  pbVar6[iVar11].header = (bcf_hdr_t *)0x0;
  (&pbVar6[iVar11].header)[1] = (bcf_hdr_t *)0x0;
  pbVar6[iVar11].fname = (char *)0x0;
  (&pbVar6[iVar11].fname)[1] = (char *)0x0;
  pbVar3 = pbVar6 + iVar11;
  pbVar3->nbuffer = 0;
  pbVar3->mbuffer = 0;
  *(undefined8 *)(&pbVar3->nbuffer + 2) = 0;
  pbVar6[iVar11].filter_ids = (int *)0x0;
  (&pbVar6[iVar11].filter_ids)[1] = (int *)0x0;
  *(undefined8 *)&pbVar6[iVar11].n_smpl = 0;
  pbVar6[iVar11].file = hfp;
  files->errnum = open_failed;
  hVar1 = (hfp->format).format;
  if (files->require_index == 0) {
    if ((hVar1 & ~binary_format) != vcf) {
LAB_00111369:
      files->errnum = file_type_error;
      return 0;
    }
    pbVar8 = bcf_hdr_read(hfp);
    pbVar12->header = pbVar8;
    files->streaming = 1;
  }
  else if (hVar1 == bcf) {
    if ((hfp->format).compression != bgzf) {
LAB_0011149a:
      files->errnum = not_bgzf;
      return 0;
    }
    pbVar8 = bcf_hdr_read(hfp);
    pbVar12->header = pbVar8;
    phVar9 = hts_idx_load(fname,0);
    pbVar12->bcf_idx = phVar9;
    if (phVar9 == (hts_idx_t *)0x0) {
      files->errnum = idx_load_failed;
      return 0;
    }
  }
  else {
    if (hVar1 != vcf) goto LAB_00111369;
    if ((hfp->format).compression != bgzf) goto LAB_0011149a;
    ptVar7 = tbx_index_load(fname);
    pbVar12->tbx_idx = ptVar7;
    if (ptVar7 == (tbx_t *)0x0) {
      files->errnum = idx_load_failed;
      return 0;
    }
    pbVar8 = bcf_hdr_read(pbVar12->file);
    pbVar12->header = pbVar8;
  }
  if (files->streaming != 0) {
    if (1 < files->nreaders) {
      files->errnum = api_usage_error;
      fprintf(_stderr,"[%s:%d %s] Error: %d readers, yet require_index not set\n",
              "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
              ,0xd0,"bcf_sr_add_reader");
      return 0;
    }
    if (files->regions != (bcf_sr_regions_t *)0x0) {
      files->errnum = api_usage_error;
      fprintf(_stderr,"[%s:%d %s] Error: cannot tabix-jump in streaming mode\n",
              "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/synced_bcf_reader.c"
              ,0xd6,"bcf_sr_add_reader");
      return 0;
    }
  }
  local_38 = pbVar12->header;
  if (local_38 == (bcf_hdr_t *)0x0) {
    files->errnum = header_error;
    return 0;
  }
  pbVar12->fname = fname;
  pcVar14 = files->apply_filters;
  if (pcVar14 != (char *)0x0) {
    local_58 = (char *)0x0;
    _n = 0;
    sStack_60 = 0;
    local_70 = (char *)0x0;
    iVar11 = 0;
    piVar5 = (int *)0x0;
    p = pcVar14;
    pcVar2 = pcVar14;
    local_48 = pbVar12;
    local_40 = files;
    do {
      if ((*pcVar2 == ',') || (*pcVar2 == '\0')) {
        lVar13 = (long)iVar11;
        piVar5 = (int *)realloc(piVar5,lVar13 * 4 + 4);
        if ((p + 1 != pcVar14) || (iVar4 = -1, *p != '.')) {
          _n = 0;
          kputsn(p,(int)pcVar14 - (int)p,(kstring_t *)&n);
          local_70 = local_58;
          iVar4 = bcf_hdr_id2int(local_38,0,local_58);
        }
        iVar11 = iVar11 + 1;
        piVar5[lVar13] = iVar4;
        p = pcVar2 + 1;
        if (*pcVar2 == '\0') goto LAB_001114a5;
      }
      pcVar14 = pcVar14 + 1;
      pcVar2 = pcVar2 + 1;
    } while( true );
  }
LAB_001114cb:
  if ((files->explicit_regs == 0) && (files->streaming == 0)) {
    if (pbVar12->tbx_idx == (tbx_t *)0x0) {
      __ptr = bcf_hdr_seqnames(pbVar12->header,&n);
    }
    else {
      __ptr = tbx_seqnames(pbVar12->tbx_idx,&n);
    }
    for (lVar13 = 0; lVar13 < n; lVar13 = lVar13 + 1) {
      if (files->regions == (bcf_sr_regions_t *)0x0) {
        pbVar10 = _regions_init_string(__ptr[lVar13]);
        files->regions = pbVar10;
      }
      else {
        _regions_add(files->regions,__ptr[lVar13],-1,-1);
      }
    }
    free(__ptr);
  }
  return 1;
LAB_001114a5:
  if (sStack_60 != 0) {
    free(local_70);
  }
  local_48->nfilter_ids = iVar11;
  local_48->filter_ids = piVar5;
  pbVar12 = local_48;
  files = local_40;
  goto LAB_001114cb;
}

Assistant:

int bcf_sr_add_reader(bcf_srs_t *files, const char *fname)
{
    htsFile* file_ptr = hts_open(fname, "r");
    if ( ! file_ptr ) {
        files->errnum = open_failed;
        return 0;
    }

    files->has_line = (int*) realloc(files->has_line, sizeof(int)*(files->nreaders+1));
    files->has_line[files->nreaders] = 0;
    files->readers  = (bcf_sr_t*) realloc(files->readers, sizeof(bcf_sr_t)*(files->nreaders+1));
    bcf_sr_t *reader = &files->readers[files->nreaders++];
    memset(reader,0,sizeof(bcf_sr_t));

    reader->file = file_ptr;

    files->errnum = 0;

    if ( files->require_index )
    {
        if ( reader->file->format.format==vcf )
        {
            if ( reader->file->format.compression!=bgzf )
            {
                files->errnum = not_bgzf;
                return 0;
            }

            reader->tbx_idx = tbx_index_load(fname);
            if ( !reader->tbx_idx )
            {
                files->errnum = idx_load_failed;
                return 0;
            }

            reader->header = bcf_hdr_read(reader->file);
        }
        else if ( reader->file->format.format==bcf )
        {
            if ( reader->file->format.compression!=bgzf )
            {
                files->errnum = not_bgzf;
                return 0;
            }

            reader->header = bcf_hdr_read(reader->file);

            reader->bcf_idx = bcf_index_load(fname);
            if ( !reader->bcf_idx )
            {
                files->errnum = idx_load_failed;
                return 0;
            }
        }
        else
        {
            files->errnum = file_type_error;
            return 0;
        }
    }
    else
    {
        if ( reader->file->format.format==bcf || reader->file->format.format==vcf )
        {
            reader->header = bcf_hdr_read(reader->file);
        }
        else
        {
            files->errnum = file_type_error;
            return 0;
        }
        files->streaming = 1;
    }
    if ( files->streaming && files->nreaders>1 )
    {
        files->errnum = api_usage_error;
        fprintf(stderr,"[%s:%d %s] Error: %d readers, yet require_index not set\n", __FILE__,__LINE__,__FUNCTION__,files->nreaders);
        return 0;
    }
    if ( files->streaming && files->regions )
    {
        files->errnum = api_usage_error;
        fprintf(stderr,"[%s:%d %s] Error: cannot tabix-jump in streaming mode\n", __FILE__,__LINE__,__FUNCTION__);
        return 0;
    }
    if ( !reader->header )
    {
        files->errnum = header_error;
        return 0;
    }

    reader->fname = fname;
    if ( files->apply_filters )
        reader->filter_ids = init_filters(reader->header, files->apply_filters, &reader->nfilter_ids);

    // Update list of chromosomes
    if ( !files->explicit_regs && !files->streaming )
    {
        int n,i;
        const char **names = reader->tbx_idx ? tbx_seqnames(reader->tbx_idx, &n) : bcf_hdr_seqnames(reader->header, &n);
        for (i=0; i<n; i++)
        {
            if ( !files->regions )
                files->regions = _regions_init_string(names[i]);
            else
                _regions_add(files->regions, names[i], -1, -1);
        }
        free(names);
    }

    return 1;
}